

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O0

int linux_kevent_copyout(kqueue *kq,int nready,kevent *el,int nevents)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  uint *puVar6;
  int in_ECX;
  ulong in_RDX;
  int in_ESI;
  eventfd *efd;
  knote *write;
  knote *kn_1;
  fd_state *fds;
  knote *kn;
  int rv;
  epoll_udata *epoll_udata;
  epoll_event *ev;
  int i;
  kevent *el_end;
  kevent *el_p;
  undefined4 in_stack_ffffffffffffff78;
  filter *in_stack_ffffffffffffff80;
  epoll_event *in_stack_ffffffffffffff88;
  epoll_event *in_stack_ffffffffffffff90;
  kevent *in_stack_ffffffffffffff98;
  int local_3c;
  ulong local_30;
  
  uVar4 = in_RDX + (long)in_ECX * 0x20;
  local_30 = in_RDX;
  for (local_3c = 0; local_3c < in_ESI; local_3c = local_3c + 1) {
    lVar5 = __tls_get_addr(&PTR_00110fd0);
    puVar6 = (uint *)(lVar5 + 0x1930 + (long)local_3c * 0xc);
    puVar1 = *(undefined8 **)(puVar6 + 1);
    if (puVar1 != (undefined8 *)0x0) {
      iVar3 = *(int *)(puVar1 + 1);
      iVar2 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
      if (iVar3 == 1) {
        if ((uVar4 <= local_30) ||
           (iVar3 = linux_kevent_copyout_ev
                              (in_stack_ffffffffffffff98,iVar2,in_stack_ffffffffffffff88,
                               in_stack_ffffffffffffff80,
                               (knote *)CONCAT44(1,in_stack_ffffffffffffff78)), iVar3 < 0)) break;
        local_30 = local_30 + (long)iVar3 * 0x20;
      }
      else if (iVar3 == 2) {
        in_stack_ffffffffffffff98 = (kevent *)*puVar1;
        in_stack_ffffffffffffff88 = (epoll_event *)in_stack_ffffffffffffff98[1].data;
        lVar5._0_2_ = in_stack_ffffffffffffff98[1].filter;
        lVar5._2_2_ = in_stack_ffffffffffffff98[1].flags;
        lVar5._4_4_ = in_stack_ffffffffffffff98[1].fflags;
        if ((lVar5 != 0) && ((*puVar6 & 0x2019) != 0)) {
          if ((uVar4 <= local_30) ||
             (iVar2 = linux_kevent_copyout_ev
                                (in_stack_ffffffffffffff98,lVar5._4_4_,in_stack_ffffffffffffff88,
                                 in_stack_ffffffffffffff80,
                                 (knote *)CONCAT44(2,in_stack_ffffffffffffff78)), iVar2 < 0)) break;
          local_30 = local_30 + (long)iVar2 * 0x20;
        }
        in_stack_ffffffffffffff90 = in_stack_ffffffffffffff88;
        if ((in_stack_ffffffffffffff88 != (epoll_event *)0x0) && ((*puVar6 & 0x1c) != 0)) {
          if ((uVar4 <= local_30) ||
             (iVar3 = linux_kevent_copyout_ev
                                (in_stack_ffffffffffffff98,
                                 (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                                 in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                 (knote *)CONCAT44(iVar3,in_stack_ffffffffffffff78)), iVar3 < 0))
          break;
          local_30 = local_30 + (long)iVar3 * 0x20;
        }
      }
      else {
        if (iVar3 != 3) {
          return -1;
        }
        in_stack_ffffffffffffff80 = (filter *)*puVar1;
        iVar3 = linux_kevent_copyout_ev
                          (in_stack_ffffffffffffff98,iVar2,in_stack_ffffffffffffff88,
                           in_stack_ffffffffffffff80,(knote *)CONCAT44(3,in_stack_ffffffffffffff78))
        ;
        if (iVar3 < 0) break;
        local_30 = local_30 + (long)iVar3 * 0x20;
      }
    }
  }
  return (int)((long)(local_30 - in_RDX) >> 5);
}

Assistant:

int
linux_kevent_copyout(struct kqueue *kq, int nready, struct kevent *el, int nevents)
{
    struct kevent   *el_p = el, *el_end = el + nevents;
    int             i;

    dbg_printf("got %i events from epoll", nready);

    for (i = 0; i < nready; i++) {
        struct epoll_event    *ev = &epoll_events[i];    /* Thread local storage populated in linux_kevent_wait */
        struct epoll_udata    *epoll_udata = ev->data.ptr;
        int                   rv;

        if (!epoll_udata) {
            dbg_puts("event has no knote, skipping..."); /* Forgot to call KN_UDATA()? */
            continue;
        }

        dbg_printf("[%i] %s", i, epoll_event_dump(ev));

        /*
         * epoll event is associated with a single filter
         * so we just have one knote per event.
         *
         * As different filters store pointers to different
         * structures, we need to examine ud_type to figure
         * out what epoll_data contains.
         */
        switch (epoll_udata->ud_type) {
        case EPOLL_UDATA_KNOTE:
        {
            struct knote *kn = epoll_udata->ud_kn;

            assert(kn);
            if (el_p >= el_end) {
            oos:
                dbg_printf("no more available kevent slots, used %zu", el_p - el);
                goto done;
            }

            rv = linux_kevent_copyout_ev(el_p, (el_end - el_p), ev, knote_get_filter(kn), kn);
            if (rv < 0) goto done;
            el_p += rv;
        }
            break;

        /*
         * epoll event is associated with one filter for
         * reading and one filter for writing.
         */
        case EPOLL_UDATA_FD_STATE:
        {
            struct fd_state   *fds = epoll_udata->ud_fds;
            struct knote      *kn, *write;
            assert(fds);

            /*
             * fds can be freed after the first linux_kevent_copyout_ev
             * so cache the pointer value here.
             */
            write = fds->fds_write;

            /*
             *    FD, or errored, or other side shutdown
             */
            if ((kn = fds->fds_read) && (ev->events & (EPOLLIN | EPOLLHUP | EPOLLRDHUP | EPOLLERR))) {
                if (el_p >= el_end) goto oos;

                rv = linux_kevent_copyout_ev(el_p, (el_end - el_p), ev, knote_get_filter(kn), kn);
                if (rv < 0) goto done;
                el_p += rv;
            }

            /*
             *    FD is writable, or errored, or other side shutdown
             */
            if ((kn = write) && (ev->events & (EPOLLOUT | POLLHUP | EPOLLERR))) {
                if (el_p >= el_end) goto oos;

                rv = linux_kevent_copyout_ev(el_p, (el_end - el_p), ev, knote_get_filter(kn), kn);
                if (rv < 0) goto done;
                el_p += rv;
            }
        }
            break;

        case EPOLL_UDATA_EVENT_FD:
        {
            struct eventfd    *efd = epoll_udata->ud_efd;

            assert(efd);

            rv = linux_kevent_copyout_ev(el_p, (el_end - el_p), ev, efd->ef_filt, NULL);
            if (rv < 0) goto done;
            el_p += rv;
            break;
        }

        /*
         *    Bad udata value. Maybe use after free?
         */
        default:
            assert(0);
            return (-1);
        }
    }

done:
    return el_p - el;
}